

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v128 __thiscall simd_test_sse2::c_imm_v128_shl_n_16<10>(simd_test_sse2 *this,c_v128 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  c_v128 cVar3;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a.u64[0];
  auVar1 = psllw(auVar1,10);
  cVar3._8_8_ = auVar1._0_8_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this;
  auVar1 = psllw(auVar2,10);
  cVar3._0_8_ = auVar1._0_8_;
  return cVar3;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shl_16(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 15) {
    fprintf(stderr, "Error: Undefined u16 shift left %d\n", n);
    abort();
  }
  for (c = 0; c < 4; c++) t.u16[c] = (uint16_t)(a.u16[c] << n);
  return t;
}